

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O3

void pull0_pipe_close(void *arg)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x38));
  *(undefined1 *)((long)arg + 0x1e0) = 1;
  iVar2 = nni_list_node_active((nni_list_node *)((long)arg + 0x1e8));
  if (iVar2 != 0) {
    nni_list_node_remove((nni_list_node *)((long)arg + 0x1e8));
    iVar2 = nni_list_empty((nni_list *)(lVar1 + 8));
    if (iVar2 != 0) {
      nni_pollable_clear((nni_pollable *)(lVar1 + 0x60));
    }
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x38));
  nni_aio_close((nni_aio *)((long)arg + 0x18));
  return;
}

Assistant:

static void
pull0_pipe_close(void *arg)
{
	pull0_pipe *p = arg;
	pull0_sock *s = p->s;

	nni_mtx_lock(&s->m);
	p->closed = true;
	if (nni_list_node_active(&p->node)) {
		nni_list_node_remove(&p->node);
		if (nni_list_empty(&s->pl)) {
			nni_pollable_clear(&s->readable);
		}
	}
	nni_mtx_unlock(&s->m);

	nni_aio_close(&p->aio);
}